

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QDBusSlotCache::Key,_QDBusSlotCache::Data>_>::
findOrInsert<QDBusSlotCache::Key>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<QDBusSlotCache::Key,_QDBusSlotCache::Data>_> *this,Key *key)

{
  Span *pSVar1;
  bool bVar2;
  QHashMultiReturnType<QString,_QFlags<QDBusConnection::RegisterOption>_> hash;
  Bucket BVar3;
  
  hash = qHashMulti<QString,QFlags<QDBusConnection::RegisterOption>>
                   (this->seed,&key->memberWithSignature,&key->flags);
  if (this->numBuckets == 0) {
    BVar3 = (Bucket)ZEXT816(0);
  }
  else {
    BVar3 = findBucketWithHash<QDBusSlotCache::Key>(this,key,hash);
    bVar2 = true;
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) goto LAB_00154338;
  }
  if (this->numBuckets >> 1 <= this->size) {
    rehash(this,this->size + 1);
    BVar3 = findBucketWithHash<QDBusSlotCache::Key>(this,key,hash);
  }
  Span<QHashPrivate::Node<QDBusSlotCache::Key,_QDBusSlotCache::Data>_>::insert
            (BVar3.span,BVar3.index);
  this->size = this->size + 1;
  bVar2 = false;
LAB_00154338:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar3.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar3.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }